

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIFloatDecoder::decode(FIFloatDecoder *this,uint8_t *data,size_t len)

{
  uint uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_t i;
  ulong uVar3;
  shared_ptr<const_Assimp::FIValue> sVar4;
  float f;
  undefined4 uStack_54;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  vector<float,_std::allocator<float>_> value;
  
  if ((in_RCX & 3) == 0) {
    value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    value.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::reserve(&value,in_RCX >> 2);
    for (uVar3 = 0; in_RCX >> 2 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = *(uint *)(len + uVar3 * 4);
      f = (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
      std::vector<float,_std::allocator<float>_>::push_back(&value,&f);
    }
    FIFloatValue::create((vector<float,_std::allocator<float>_> *)&f);
    _Var2._M_pi = _Stack_50._M_pi;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *this = _f;
    this[1] = (FIFloatDecoder)_Var2._M_pi;
    _f = (FIFloatDecoder)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&value.super__Vector_base<float,_std::allocator<float>_>);
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<const_Assimp::FIValue>)
           sVar4.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 3) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<float> value;
        size_t numFloats = len / 4;
        value.reserve(numFloats);
        for (size_t i = 0; i < numFloats; ++i) {
            int v = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
            float f;
            memcpy(&f, &v, 4);
            value.push_back(f);
            data += 4;
        }
        return FIFloatValue::create(std::move(value));
    }